

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<std::complex<long_double>_>::SolveEigensystemJacobi
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<std::complex<long_double>_> *Eigenvalues,
          TPZFMatrix<std::complex<long_double>_> *Eigenvectors)

{
  long lVar1;
  longdouble *plVar2;
  longdouble *plVar3;
  long lVar4;
  ulong uVar5;
  int64_t j;
  long lVar6;
  TPZFNMatrix<9,_std::complex<long_double>_> Matrix;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined **local_208;
  long local_200;
  long lStack_1f8;
  undefined2 local_1f0;
  longdouble *local_1e8;
  longdouble *local_1e0;
  undefined8 local_1d8;
  TPZVec<int> local_1d0;
  int local_1b0 [6];
  undefined **local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  longdouble local_178 [20];
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  local_1e8 = local_178;
  local_1f0 = 0;
  local_208 = &PTR__TPZFMatrix_0186a728;
  local_1d8 = 9;
  local_200 = lVar1;
  lStack_1f8 = lVar1;
  local_1e0 = local_1e8;
  TPZVec<int>::TPZVec(&local_1d0,0);
  local_1d0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1d0.fStore = local_1b0;
  local_1d0.fNElements = 0;
  local_1d0.fNAlloc = 0;
  local_198 = &PTR__TPZVec_018462a8;
  local_190 = 0;
  uStack_188 = 0;
  local_180 = 0;
  plVar2 = (longdouble *)0x0;
  if ((lVar1 != 0) && (uVar5 = lVar1 * lVar1, plVar2 = local_1e8, 9 < uVar5)) {
    plVar2 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3b != 0) | uVar5 * 0x20);
    plVar3 = plVar2;
    do {
      *plVar3 = (longdouble)0;
      plVar3[1] = (longdouble)0;
      plVar3 = plVar3 + 2;
    } while (plVar3 != plVar2 + uVar5 * 2);
  }
  local_1e8 = plVar2;
  local_208 = &PTR__TPZFNMatrix_0186a438;
  lVar4 = 0xa0;
  do {
    *(longdouble *)((long)&local_218 + lVar4) = (longdouble)0;
    *(longdouble *)((long)&local_208 + lVar4) = (longdouble)0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x1e0);
  if (0 < lVar1) {
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                  (&local_228,this,lVar4,lVar6);
        if ((local_200 <= lVar4) || (lStack_1f8 <= lVar6)) {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)(local_1e8 + local_200 * lVar6 * 2 + lVar4 * 2 + 1) = local_218;
        *(undefined8 *)((long)(local_1e8 + local_200 * lVar6 * 2 + lVar4 * 2 + 1) + 8) = uStack_210;
        *(undefined8 *)(local_1e8 + local_200 * lVar6 * 2 + lVar4 * 2) = local_228;
        *(undefined8 *)((long)(local_1e8 + local_200 * lVar6 * 2 + lVar4 * 2) + 8) = uStack_220;
        lVar6 = lVar6 + 1;
      } while (lVar1 != lVar6);
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x5af);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}